

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  IConfig *pIVar7;
  long in_RDI;
  Colour colour;
  undefined4 in_stack_ffffffffffffff08;
  Code in_stack_ffffffffffffff0c;
  Colour *in_stack_ffffffffffffff10;
  allocator local_41;
  string local_40 [64];
  
  poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),"\n");
  pcVar5 = getLineOfChars<(char)126>();
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::operator<<(poVar4,"\n");
  Colour::Colour(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  poVar4 = *(ostream **)(in_RDI + 0x18);
  psVar6 = (string *)
           Option<Catch::TestRunInfo>::operator->((Option<Catch::TestRunInfo> *)(in_RDI + 0x20));
  poVar4 = std::operator<<(poVar4,psVar6);
  poVar4 = std::operator<<(poVar4," is a Catch v");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,libraryVersion);
  poVar4 = std::operator<<(poVar4,".");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,DAT_002c47e4);
  poVar4 = std::operator<<(poVar4," b");
  std::ostream::operator<<(poVar4,DAT_002c47e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"master",&local_41);
  bVar1 = std::operator!=(&in_stack_ffffffffffffff10->m_moved,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18)," (");
    poVar4 = std::operator<<(poVar4,DAT_002c47f0);
    std::operator<<(poVar4,")");
  }
  poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18)," host application.\n");
  std::operator<<(poVar4,"Run with -? for options\n\n");
  pIVar7 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)(in_RDI + 0x10));
  iVar2 = (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
  if (iVar2 != 0) {
    poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),"Randomness seeded to: ");
    pIVar7 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)(in_RDI + 0x10));
    uVar3 = (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])();
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
    std::operator<<(poVar4,"\n\n");
  }
  *(undefined1 *)(in_RDI + 0x48) = 1;
  Colour::~Colour((Colour *)0x274680);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }